

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<double>::CallOut(ChValueSpecific<double> *this,ChArchiveOut *marchive)

{
  double *t;
  char *custom_name;
  ChNameValue<double> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<double> *this_local;
  
  t = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  custom_name = (char *)std::__cxx11::string::c_str();
  make_ChNameValue<double>(&local_30,"*this->_ptr_to_val",t,custom_name,'\0');
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_30);
  ChNameValue<double>::~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}